

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_foreach_do::translate
          (method_foreach_do *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  token_base *ptVar1;
  compiler_type *this_00;
  _Elt_pointer pdVar2;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  statement_foreach *this_01;
  statement_expression *this_02;
  _Elt_pointer pptVar6;
  internal_error *this_03;
  compile_error *this_04;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *ast;
  value_type ptVar7;
  initializer_list<cs::statement_base_*> __l;
  allocator_type local_1d9;
  tree_type<cs::token_base_*> local_1d8;
  tree_type<cs::token_base_*> local_1d0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  string local_158;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_138;
  _Self local_e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_c8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_78;
  _Self local_50;
  
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar7 = *pptVar4;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)ptVar7[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  if (*pptVar5 == (token_base *)0x0) {
    this_03 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&body,"Null pointer accessed.",(allocator *)&local_138);
    internal_error::internal_error(this_03,(string *)&body);
    __cxa_throw(this_03,&internal_error::typeinfo,internal_error::~internal_error);
  }
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)ptVar7[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 4) {
    body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)ptVar7[1]._vptr_token_base;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
    ptVar1 = *pptVar5;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
              (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
    ;
    this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e8._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_e8._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_first;
    local_e8._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_e8._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_node;
    std::operator+(&local_50,&local_e8,1);
    local_78._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_78._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_78._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_78._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::
    deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)&local_138,&local_50,&local_78,&local_1d9);
    ast = &local_138;
    compiler_type::translate(this_00,ast,&body);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque(&local_138);
    this_01 = (statement_foreach *)statement_base::operator_new((statement_base *)0x98,(size_t)ast);
    std::__cxx11::string::string((string *)&local_158,(string *)(ptVar1 + 3));
    pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                        ((raw->
                         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                         )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
    ptVar7 = *pptVar4 + 1;
    tree_type<cs::token_base_*>::tree_type(&local_1d0,(tree_type<cs::token_base_*> *)ptVar7);
    this_02 = (statement_expression *)
              statement_base::operator_new((statement_base *)0x28,(size_t)ptVar7);
    pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                        ((raw->
                         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                         )._M_impl.super__Deque_impl_data._M_start._M_cur,5);
    tree_type<cs::token_base_*>::tree_type(&local_1d8,(tree_type<cs::token_base_*> *)(*pptVar4 + 1))
    ;
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b8,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
              );
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar6 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_expression::statement_expression
              (this_02,&local_1d8,(context_t *)&local_1b8,pptVar6[-1]);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_138;
    local_138.
    super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_02;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,__l,
               (allocator_type *)&local_e8);
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c8,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
              );
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar6 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_foreach::statement_foreach
              (this_01,&local_158,&local_1d0,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
               (context_t *)&local_1c8,pptVar6[-1]);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
    tree_type<cs::token_base_*>::~tree_type(&local_1d8);
    tree_type<cs::token_base_*>::~tree_type(&local_1d0);
    std::__cxx11::string::~string((string *)&local_158);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
    ;
    return &this_01->super_statement_base;
  }
  this_04 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&body,"Wrong grammar in foreach statement, expect <id>",
             (allocator *)&local_138);
  compile_error::compile_error(this_04,(string *)&body);
  __cxa_throw(this_04,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_foreach_do::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar in foreach statement, expect <id>");
		const std::string &it = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_foreach(it, static_cast<token_expr *>(raw.front().at(3))->get_tree(), {
			new statement_expression(static_cast<token_expr *>(raw.front().at(5))->get_tree(),
			                         context, raw.front().back())
		}, context,
		raw.front().back());
	}